

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxVMFunctionCall::Resolve(FxVMFunctionCall *this,FCompileContext *ctx)

{
  int iVar1;
  PFunction *pPVar2;
  Variant *pVVar3;
  PPrototype *pPVar4;
  PType *pPVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  FxConstant *this_00;
  undefined4 extraout_var_00;
  FxTypeCast *this_01;
  FxExpression *pFVar9;
  PPointer *pPVar10;
  PVoidType **ppPVar11;
  FxExpression **ppFVar12;
  char *pcVar13;
  char *message;
  long lVar14;
  FxVMFunctionCall *pFVar15;
  uint uVar16;
  long lVar17;
  PClass *size;
  PClass *size_00;
  ulong uVar18;
  ulong uVar19;
  TArray<FxExpression_*,_FxExpression_*> *pTVar20;
  PType *local_a0;
  FScriptPosition *local_98;
  bool writable;
  uint local_8c;
  Variant *local_88;
  ulong local_80;
  FCompileContext *local_78;
  ulong local_70;
  TArray<FxExpression_*,_FxExpression_*> *local_68;
  long local_60;
  FxVMFunctionCall *local_58;
  ulong local_50;
  ulong local_48;
  VMFunction *local_40;
  FxConstant *local_38;
  undefined4 extraout_var_01;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  pFVar9 = this->Self;
  pFVar15 = this;
  if (pFVar9 != (FxExpression *)0x0) {
    iVar7 = (*pFVar9->_vptr_FxExpression[2])(pFVar9,ctx);
    this->Self = (FxExpression *)CONCAT44(extraout_var,iVar7);
    if ((FxExpression *)CONCAT44(extraout_var,iVar7) == (FxExpression *)0x0) goto LAB_00516c87;
  }
  pPVar2 = this->Function;
  pVVar3 = (pPVar2->Variants).Array;
  uVar8 = pVVar3->Flags;
  uVar19 = 3;
  if ((uVar8 & 4) == 0) {
    uVar19 = (ulong)(uVar8 >> 1 & 1);
  }
  pPVar4 = pVVar3->Proto;
  local_40 = pVVar3->Implementation;
  if ((pFVar9 == (FxExpression *)0x0) && ((uVar8 & 2) != 0)) {
    pcVar13 = "Call to non-static function without a self pointer";
LAB_00516833:
    FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,pcVar13);
  }
  else {
    uVar8 = (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count;
    if (uVar8 == 0) {
      if ((((pPVar4->ArgumentTypes).Count <= (uint)uVar19) ||
          ((pPVar4->ArgumentTypes).Array[uVar19] == (PType *)0x0)) ||
         (((pVVar3->ArgFlags).Array[uVar19] & 1) != 0)) {
LAB_00516cf9:
        if ((pPVar4->ReturnTypes).Count == 0) {
          ppPVar11 = &TypeVoid;
        }
        else {
          ppPVar11 = (PVoidType **)(pPVar4->ReturnTypes).Array;
        }
        (this->super_FxExpression).ValueType = &(*ppPVar11)->super_PType;
        return &this->super_FxExpression;
      }
      pcVar13 = FName::NameData.NameArray
                [*(int *)&(pPVar2->super_PSymbol).super_PTypeBase.super_DObject.field_0x24].Text;
      message = "Insufficient arguments in call to %s";
    }
    else {
      uVar16 = (pPVar4->ArgumentTypes).Count;
      if (((pPVar4->ArgumentTypes).Array[uVar16 - 1] == (PType *)0x0) ||
         (uVar8 + (uint)uVar19 <= uVar16)) {
        pTVar20 = &(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>;
        local_8c = 0;
        local_60 = 0;
        size = (PClass *)0x0;
        uVar16 = 0;
        local_a0 = (PType *)0x0;
        uVar18 = 0;
        local_70 = 0;
        local_88 = pVVar3;
        local_78 = ctx;
        local_68 = pTVar20;
        local_50 = uVar19;
        while( true ) {
          local_98 = &(this->super_FxExpression).ScriptPosition;
          iVar7 = (int)uVar19;
          if ((PClass *)(ulong)uVar8 <= size) break;
          if ((uVar18 & 1) == 0) {
            uVar8 = (int)size + iVar7;
            pPVar5 = (pPVar4->ArgumentTypes).Array[uVar8];
            if (pPVar5 == (PType *)0x0) {
              uVar18 = CONCAT71((int7)(uVar18 >> 8),1);
              goto LAB_0051696f;
            }
            uVar16 = (local_88->ArgFlags).Array[uVar8];
            local_a0 = pPVar5;
          }
          else {
LAB_0051696f:
            if (local_a0 == (PType *)0x0) {
              __assert_fail("type != nullptr",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                            ,0x1e8c,
                            "virtual FxExpression *FxVMFunctionCall::Resolve(FCompileContext &)");
            }
          }
          ppFVar12 = ((TArray<FxExpression_*,_FxExpression_*> *)&pTVar20->Array)->Array;
          pFVar9 = ppFVar12[(long)size];
          if (pFVar9->ExprType == EFX_NamedNode) {
            if ((uVar16 & 1) == 0) {
              pcVar13 = 
              "Cannot use a named argument here - not all required arguments have been passed.";
              goto LAB_00516833;
            }
            if ((uVar18 & 1) != 0) {
              pcVar13 = "Cannot use a named argument in the varargs part of the parameter list.";
              goto LAB_00516833;
            }
            iVar1 = *(int *)&pFVar9[1]._vptr_FxExpression;
            size_00 = (PClass *)0x0;
            lVar17 = local_60;
            while( true ) {
              local_80 = uVar18;
              if ((PClass *)(ulong)((local_88->ArgNames).Count - iVar7) == size_00) {
                pcVar13 = FName::NameData.NameArray[iVar1].Text;
                message = "Named argument %s not found.";
                goto LAB_00516c80;
              }
              if ((local_88->ArgNames).Array[(uint)((int)local_50 + (int)size_00)].Index == iVar1)
              break;
              size_00 = (PClass *)
                        ((long)&(size_00->super_PNativeStruct).super_PStruct.super_PNamedType.
                                super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
                                _vptr_DObject + 1);
              lVar17 = lVar17 + 0x100000000;
            }
            if (size_00 < size) {
              pcVar13 = FName::NameData.NameArray[iVar1].Text;
              message = "Named argument %s comes before current position in argument list.";
              goto LAB_00516c80;
            }
            ppFVar12[(long)size] = (FxExpression *)pFVar9[1].ScriptPosition.FileName.Chars;
            pFVar9[1].ScriptPosition.FileName.Chars = (char *)0x0;
            local_58 = pFVar15;
            (*pFVar9->_vptr_FxExpression[1])();
            uVar8 = local_8c;
            local_48 = uVar19;
            for (lVar14 = 0; lVar14 < lVar17 >> 0x20; lVar14 = lVar14 + 1) {
              uVar19 = (ulong)((int)local_48 + uVar8);
              pPVar10 = (PPointer *)(pPVar4->ArgumentTypes).Array[uVar19];
              if (((*(byte *)((long)(local_88->ArgFlags).Array + uVar19 * 4 + 2) & 1) != 0) &&
                 (size_00 = PPointer::RegistrationInfo.MyClass,
                 bVar6 = DObject::IsKindOf((DObject *)pPVar10,PPointer::RegistrationInfo.MyClass),
                 pPVar10 = TypeNullPtr, !bVar6)) {
                __assert_fail("ntype->IsKindOf(RUNTIME_CLASS(PPointer))",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                              ,0x1eb6,
                              "virtual FxExpression *FxVMFunctionCall::Resolve(FCompileContext &)");
              }
              this_00 = (FxConstant *)
                        FxExpression::operator_new((FxExpression *)0x38,(size_t)size_00);
              FxConstant::FxConstant
                        (this_00,(PType *)pPVar10,(local_40->DefaultArgs).Array + uVar19,local_98);
              pTVar20 = local_68;
              size_00 = (PClass *)(ulong)uVar8;
              local_38 = this_00;
              TArray<FxExpression_*,_FxExpression_*>::Insert
                        (local_68,uVar8,(FxExpression **)&local_38);
              uVar8 = uVar8 + 1;
            }
            uVar8 = (int)size + (int)local_48;
            local_a0 = (pPVar4->ArgumentTypes).Array[uVar8];
            uVar16 = (local_88->ArgFlags).Array[uVar8];
            pFVar15 = local_58;
            uVar18 = local_80;
            uVar19 = local_48;
          }
          if ((uVar16 & 0x10800) == 0) {
            this_01 = (FxTypeCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)size);
            FxTypeCast::FxTypeCast
                      (this_01,((TArray<FxExpression_*,_FxExpression_*> *)&local_68->Array)->Array
                               [(long)size],local_a0,false,false);
            pTVar20 = local_68;
            iVar7 = (*(this_01->super_FxExpression)._vptr_FxExpression[2])(this_01,local_78);
            pFVar9 = (FxExpression *)CONCAT44(extraout_var_01,iVar7);
          }
          else {
            pFVar9 = ((TArray<FxExpression_*,_FxExpression_*> *)&pTVar20->Array)->Array[(long)size];
            iVar7 = (*pFVar9->_vptr_FxExpression[2])(pFVar9,local_78);
            ((TArray<FxExpression_*,_FxExpression_*> *)&pTVar20->Array)->Array[(long)size] =
                 (FxExpression *)CONCAT44(extraout_var_00,iVar7);
            pFVar9 = ((TArray<FxExpression_*,_FxExpression_*> *)&pTVar20->Array)->Array[(long)size];
            if (pFVar9 == (FxExpression *)0x0) {
LAB_00516c24:
              pFVar9 = (FxExpression *)0x0;
            }
            else if ((PPointer *)pFVar9->ValueType != TypeNullPtr) {
              (*pFVar9->_vptr_FxExpression[4])(pFVar9,local_78,&writable);
              ppFVar12 = ((TArray<FxExpression_*,_FxExpression_*> *)&pTVar20->Array)->Array;
              if ((uVar16 >> 0x10 & 1) != 0) {
                local_80 = uVar18;
                pPVar10 = NewPointer(ppFVar12[(long)size]->ValueType,false);
                ppFVar12 = ((TArray<FxExpression_*,_FxExpression_*> *)&pTVar20->Array)->Array;
                ppFVar12[(long)size]->ValueType = (PType *)pPVar10;
                uVar18 = local_80;
              }
              pFVar9 = ppFVar12[(long)size];
              if (local_a0 != pFVar9->ValueType) {
                FScriptPosition::Message
                          (local_98,2,"Type mismatch in reference argument %s",
                           FName::NameData.NameArray
                           [*(int *)&(pFVar15->Function->super_PSymbol).super_PTypeBase.
                                     super_DObject.field_0x24].Text);
                goto LAB_00516c24;
              }
            }
          }
          local_70 = CONCAT71((int7)(local_70 >> 8),(byte)local_70 | pFVar9 == (FxExpression *)0x0);
          (pFVar15->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array[(long)size] = pFVar9
          ;
          size = (PClass *)
                 ((long)&(size->super_PNativeStruct).super_PStruct.super_PNamedType.
                         super_PCompoundType.super_PType.super_PTypeBase.super_DObject._vptr_DObject
                 + 1);
          uVar8 = (pFVar15->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count;
          local_60 = local_60 + -0x100000000;
          local_8c = local_8c + 1;
        }
        uVar8 = uVar8 + iVar7;
        if ((((pPVar4->ArgumentTypes).Count <= uVar8) ||
            ((pPVar4->ArgumentTypes).Array[(int)uVar8] == (PType *)0x0)) ||
           (((((pFVar15->Function->Variants).Array)->ArgFlags).Array[(int)uVar8] & 1) != 0)) {
          this = pFVar15;
          if ((local_70 & 1) == 0) goto LAB_00516cf9;
          goto LAB_00516c87;
        }
        pcVar13 = FName::NameData.NameArray
                  [*(int *)&(pFVar15->Function->super_PSymbol).super_PTypeBase.super_DObject.
                            field_0x24].Text;
        message = "Insufficient arguments in call to %s";
      }
      else {
        pcVar13 = FName::NameData.NameArray
                  [*(int *)&(pPVar2->super_PSymbol).super_PTypeBase.super_DObject.field_0x24].Text;
        message = "Too many arguments in call to %s";
      }
    }
LAB_00516c80:
    FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,message,pcVar13);
  }
LAB_00516c87:
  (*(pFVar15->super_FxExpression)._vptr_FxExpression[1])(pFVar15);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxVMFunctionCall::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE_OPT(Self, ctx);
	bool failed = false;
	auto proto = Function->Variants[0].Proto;
	auto &argtypes = proto->ArgumentTypes;
	auto &argnames = Function->Variants[0].ArgNames;
	auto &argflags = Function->Variants[0].ArgFlags;
	auto &defaults = Function->Variants[0].Implementation->DefaultArgs;

	int implicit = Function->GetImplicitArgs();

	// This should never happen.
	if (Self == nullptr && (Function->Variants[0].Flags & VARF_Method))
	{
		ScriptPosition.Message(MSG_ERROR, "Call to non-static function without a self pointer");
		delete this;
		return nullptr;
	}

	if (ArgList.Size() > 0)
	{
		bool foundvarargs = false;
		PType * type = nullptr;
		int flag = 0;
		if (argtypes.Last() != nullptr && ArgList.Size() + implicit > argtypes.Size())
		{
			ScriptPosition.Message(MSG_ERROR, "Too many arguments in call to %s", Function->SymbolName.GetChars());
			delete this;
			return nullptr;
		}

		for (unsigned i = 0; i < ArgList.Size(); i++)
		{
			// Varargs must all have the same type as the last typed argument. A_Jump is the only function using it.
			if (!foundvarargs)
			{
				if (argtypes[i + implicit] == nullptr) foundvarargs = true;
				else
				{
					type = argtypes[i + implicit];
					flag = argflags[i + implicit];
				}
			}
			assert(type != nullptr);

			if (ArgList[i]->ExprType == EFX_NamedNode)
			{
				if (!(flag & VARF_Optional))
				{
					ScriptPosition.Message(MSG_ERROR, "Cannot use a named argument here - not all required arguments have been passed.");
					delete this;
					return nullptr;
				}
				if (foundvarargs)
				{
					ScriptPosition.Message(MSG_ERROR, "Cannot use a named argument in the varargs part of the parameter list.");
					delete this;
					return nullptr;
				}
				unsigned j;
				bool done = false;
				FName name = static_cast<FxNamedNode *>(ArgList[i])->name;
				for (j = 0; j < argnames.Size() - implicit; j++)
				{
					if (argnames[j + implicit] == name)
					{
						if (j < i)
						{
							ScriptPosition.Message(MSG_ERROR, "Named argument %s comes before current position in argument list.", name.GetChars());
							delete this;
							return nullptr;
						}
						// copy the original argument into the list
						auto old = static_cast<FxNamedNode *>(ArgList[i]);
						ArgList[i] = old->value; 
						old->value = nullptr;
						delete old;
						// now fill the gap with constants created from the default list so that we got a full list of arguments.
						int insert = j - i;
						for (int k = 0; k < insert; k++)
						{
							auto ntype = argtypes[i + k + implicit];
							// If this is a reference argument, the pointer type must be undone because the code below expects the pointed type as value type.
							if (argflags[i + k + implicit] & VARF_Ref)
							{
								assert(ntype->IsKindOf(RUNTIME_CLASS(PPointer)));
								ntype = TypeNullPtr; // the default of a reference type can only be a null pointer
							}
							auto x = new FxConstant(ntype, defaults[i + k + implicit], ScriptPosition);
							ArgList.Insert(i + k, x);
						}
						done = true;
						break;
					}
				}
				if (!done)
				{
					ScriptPosition.Message(MSG_ERROR, "Named argument %s not found.", name.GetChars());
					delete this;
					return nullptr;
				}
				// re-get the proper info for the inserted node.
				type = argtypes[i + implicit];
				flag = argflags[i + implicit];
			}

			FxExpression *x;
			if (!(flag & (VARF_Ref|VARF_Out)))
			{
				x = new FxTypeCast(ArgList[i], type, false);
				x = x->Resolve(ctx);
			}
			else
			{
				bool writable;
				ArgList[i] = ArgList[i]->Resolve(ctx);	// nust be resolved before the address is requested.
				if (ArgList[i] != nullptr && ArgList[i]->ValueType != TypeNullPtr)
				{
					ArgList[i]->RequestAddress(ctx, &writable);
					if (flag & VARF_Ref) ArgList[i]->ValueType = NewPointer(ArgList[i]->ValueType);
					// For a reference argument the types must match 100%.
					if (type != ArgList[i]->ValueType)
					{
						ScriptPosition.Message(MSG_ERROR, "Type mismatch in reference argument %s", Function->SymbolName.GetChars());
						x = nullptr;
					}
					else
					{
						x = ArgList[i];
					}
				}
				else x = ArgList[i];
			}
			failed |= (x == nullptr);
			ArgList[i] = x;
		}
		int numargs = ArgList.Size() + implicit;
		if ((unsigned)numargs < argtypes.Size() && argtypes[numargs] != nullptr)
		{
			auto flags = Function->Variants[0].ArgFlags[numargs];
			if (!(flags & VARF_Optional))
			{
				ScriptPosition.Message(MSG_ERROR, "Insufficient arguments in call to %s", Function->SymbolName.GetChars());
				delete this;
				return nullptr;
			}
		}
	}
	else
	{
		if ((unsigned)implicit < argtypes.Size() && argtypes[implicit] != nullptr)
		{
			auto flags = Function->Variants[0].ArgFlags[implicit];
			if (!(flags & VARF_Optional))
			{
				ScriptPosition.Message(MSG_ERROR, "Insufficient arguments in call to %s", Function->SymbolName.GetChars());
				delete this;
				return nullptr;
			}
		}
	}
	if (failed)
	{
		delete this;
		return nullptr;
	}
	TArray<PType *> &rets = proto->ReturnTypes;
	if (rets.Size() > 0)
	{
		ValueType = rets[0];
	}
	else
	{
		ValueType = TypeVoid;
	}
	return this;
}